

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O1

int Acec_InsertBox_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = pObj->Value;
  if (uVar2 == 0xffffffff) {
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecNorm.c"
                    ,0x7a,"int Acec_InsertBox_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    Acec_InsertBox_rec(pNew,p,pObj + -(ulong)uVar2);
    Acec_InsertBox_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    uVar1 = *(ulong *)pObj;
    if (((int)pObj[-(uVar1 & 0x1fffffff)].Value < 0) ||
       (uVar2 = (uint)(uVar1 >> 0x20), (int)pObj[-(ulong)(uVar2 & 0x1fffffff)].Value < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    uVar2 = Gia_ManAppendAnd2(pNew,(uint)(uVar1 >> 0x1d) & 1 ^ pObj[-(uVar1 & 0x1fffffff)].Value,
                              pObj[-(ulong)(uVar2 & 0x1fffffff)].Value ^ uVar2 >> 0x1d & 1);
    pObj->Value = uVar2;
  }
  return uVar2;
}

Assistant:

int Acec_InsertBox_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( ~pObj->Value )
        return pObj->Value;
    assert( Gia_ObjIsAnd(pObj) );
    Acec_InsertBox_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Acec_InsertBox_rec( pNew, p, Gia_ObjFanin1(pObj) );
    return (pObj->Value = Gia_ManAppendAnd2( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) ));
}